

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall Compiler::compile(Compiler *this)

{
  Parser *this_00;
  bool bVar1;
  STGV *this_01;
  TCV *this_02;
  CGV *this_03;
  char *pcVar2;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string moonCommand;
  string local_e8 [8];
  string visualizerCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ASTNode *local_50;
  ASTNode *root;
  allocator local_31;
  string local_30;
  Compiler *local_10;
  Compiler *this_local;
  
  this_00 = this->parser;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"START",&local_31);
  Syntax::Parser::parse(this_00,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  AST::ASTBuilder::visualize(this->parser->AST_Builder);
  local_50 = AST::ASTBuilder::getRoot(this->parser->AST_Builder);
  this_01 = (STGV *)operator_new(0x60);
  STGV::STGV(this_01,local_50);
  this->symTabGenerator = this_01;
  STGV::getErrors_abi_cxx11_(&local_68,this->symTabGenerator);
  writeSymTabErrors(this,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  STGV::getWarnings_abi_cxx11_(&local_80,this->symTabGenerator);
  writeSymTabWarnings(this,&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  writeSymTab(this);
  STGV::getErrors_abi_cxx11_(&local_98,this->symTabGenerator);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_02 = (TCV *)operator_new(0x98);
    TCV::TCV(this_02,local_50,this->symTabGenerator);
    this->typeChecker = this_02;
    TCV::getErrors_abi_cxx11_(&local_b0,this->typeChecker);
    writeTypeCheckingErrors(this,&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    TCV::getErrors_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&visualizerCommand.field_2 + 8),this->typeChecker);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&visualizerCommand.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&visualizerCommand.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_03 = (CGV *)operator_new(0x98);
      CGV::CGV(this_03,local_50,this->symTabGenerator->symbolTable);
      this->codeGenerator = this_03;
      writeMoonOutput(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,"dot -Tpng TreeContent.gv -o TreeContent.png",
                 (allocator *)(moonCommand.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(moonCommand.field_2._M_local_buf + 0xf));
      extractFileName_abi_cxx11_(&local_170,this);
      std::operator+(&local_150,"Moon/moon Moon/Generated/",&local_170);
      std::operator+(&local_130,&local_150,".m");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_130," Moon/util.m");
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      system(pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      system(pcVar2);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string(local_e8);
    }
  }
  return;
}

Assistant:

void Compiler::compile() {
    parser->parse("START");
    parser->AST_Builder->visualize();

    AST::ASTNode *root = parser->AST_Builder->getRoot();
    symTabGenerator = new STGV(root);
    writeSymTabErrors(symTabGenerator->getErrors());
    writeSymTabWarnings(symTabGenerator->getWarnings());
    writeSymTab();
    if (!symTabGenerator->getErrors().empty()) return;

    typeChecker = new TCV(root, symTabGenerator);
    writeTypeCheckingErrors(typeChecker->getErrors());

    if (!typeChecker->getErrors().empty()) return;

    codeGenerator = new CGV(root, symTabGenerator->symbolTable);
    writeMoonOutput();

    std::string visualizerCommand = "dot -Tpng TreeContent.gv -o TreeContent.png";
    std::string moonCommand = "Moon/moon Moon/Generated/" + extractFileName() + ".m" + " Moon/util.m";

    system(visualizerCommand.c_str());
    system(moonCommand.c_str());
}